

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zello_log.h
# Opt level: O1

string * to_string_abi_cxx11_(string *__return_storage_ptr__,ze_device_fp_flags_t capabilities)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  if (capabilities != 0) {
    if ((capabilities & 1) != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    if ((capabilities & 2) != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    if ((capabilities & 4) != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    if ((capabilities & 8) != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    if ((capabilities & 0x10) != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    if ((capabilities & 0x20) != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    if ((capabilities & 0x40) != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    if (-1 < (char)capabilities) {
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const ze_device_fp_flags_t capabilities) {
  std::string capabilities_str = "";
  if (capabilities == 0) {
    capabilities_str.append("|NONE|");
    return capabilities_str;
  }
  if (capabilities & ZE_DEVICE_FP_FLAG_DENORM) {
    capabilities_str.append("|ZE_DEVICE_FP_FLAG_DENORM|");
  }
  if (capabilities & ZE_DEVICE_FP_FLAG_INF_NAN) {
    capabilities_str.append("|ZE_DEVICE_FP_FLAG_INF_NAN|");
  }
  if (capabilities & ZE_DEVICE_FP_FLAG_ROUND_TO_NEAREST) {
    capabilities_str.append("|ZE_DEVICE_FP_FLAG_ROUND_TO_NEAREST|");
  }
  if (capabilities & ZE_DEVICE_FP_FLAG_ROUND_TO_ZERO) {
    capabilities_str.append("|ZE_DEVICE_FP_FLAG_ROUND_TO_ZERO|");
  }
  if (capabilities & ZE_DEVICE_FP_FLAG_ROUND_TO_INF) {
    capabilities_str.append("|ZE_DEVICE_FP_FLAG_ROUND_TO_INF|");
  }
  if (capabilities & ZE_DEVICE_FP_FLAG_FMA) {
    capabilities_str.append("|ZE_DEVICE_FP_FLAG_FMA|");
  }
  if (capabilities & ZE_DEVICE_FP_FLAG_ROUNDED_DIVIDE_SQRT) {
    capabilities_str.append("|ZE_DEVICE_FP_FLAG_ROUNDED_DIVIDE_SQRT|");
  }
  if (capabilities & ZE_DEVICE_FP_FLAG_SOFT_FLOAT) {
    capabilities_str.append("|ZE_DEVICE_FP_FLAG_SOFT_FLOAT|");
  }
  return capabilities_str;
}